

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase100::run(TestCase100 *this)

{
  int *piVar1;
  ulong uVar2;
  int local_68;
  int local_64;
  DebugComparison<int,_int> _kjCondition;
  ConstFunction<int_(int,_int)> f;
  uint local_2c;
  ConstFunction<unsigned_int_(unsigned_int,_unsigned_int)> f2;
  
  local_2c = 0;
  f.impl.ptr = (Iface *)operator_new(0x18);
  (f.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___005883a0;
  f.impl.ptr[1]._vptr_Iface = (_func_int **)&local_2c;
  f.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::ConstFunction<int(int,int)>::Impl<kj::_::BoundMethod<kj::(anonymous_namespace)::TestConstType&,kj::(anonymous_namespace)::TestCase100::run()::$_0,kj::(anonymous_namespace)::TestCase100::run()::$_1>>>
        ::instance;
  f2.impl.ptr = (Iface *)operator_new(0x18);
  (f2.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00588408;
  f2.impl.ptr[1]._vptr_Iface = (_func_int **)&local_2c;
  f2.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::ConstFunction<unsigned_int(unsigned_int,unsigned_int)>::Impl<kj::_::BoundMethod<kj::(anonymous_namespace)::TestConstType&,kj::(anonymous_namespace)::TestCase100::run()::$_2,kj::(anonymous_namespace)::TestCase100::run()::$_3>>>
        ::instance;
  local_2c = 3;
  _kjCondition.op.content.ptr = (char *)operator_new(0x10);
  *(undefined ***)_kjCondition.op.content.ptr = &PTR_operator___00588470;
  _kjCondition.op.content.ptr[8] = '\n';
  _kjCondition.op.content.ptr[9] = '\0';
  _kjCondition.op.content.ptr[10] = '\0';
  _kjCondition.op.content.ptr[0xb] = '\0';
  _kjCondition.op.content.ptr[0xc] = '\0';
  _kjCondition.op.content.ptr[0xd] = '\0';
  _kjCondition.op.content.ptr[0xe] = '\0';
  _kjCondition.op.content.ptr[0xf] = '\0';
  _kjCondition._0_8_ =
       &kj::_::
        HeapDisposer<kj::ConstFunction<int(int,int)>::Impl<kj::_::BoundMethod<kj::(anonymous_namespace)::TestConstType,kj::(anonymous_namespace)::TestCase100::run()::$_4,kj::(anonymous_namespace)::TestCase100::run()::$_5>>>
        ::instance;
  Own<kj::ConstFunction<int_(int,_int)>::Iface,_std::nullptr_t>::operator=
            (&f.impl,(Own<kj::ConstFunction<int_(int,_int)>::Iface,_std::nullptr_t> *)&_kjCondition)
  ;
  Own<kj::ConstFunction<int_(int,_int)>::Iface,_std::nullptr_t>::dispose
            ((Own<kj::ConstFunction<int_(int,_int)>::Iface,_std::nullptr_t> *)&_kjCondition);
  _kjCondition.right = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,0x7b,0x1c8);
  piVar1 = (int *)0x24d;
  _kjCondition.left = 0x24d;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0x24d;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_68 = 0x24d;
    local_64 = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,0x7b,0x1c8);
    piVar1 = &local_64;
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
               ,0x72,ERROR,
               "\"failed: expected \" \"(123 + 456 + 10) == (f(123, 456))\", _kjCondition, 123 + 456 + 10, f(123, 456)"
               ,(char (*) [51])"failed: expected (123 + 456 + 10) == (f(123, 456))",&_kjCondition,
               &local_68,piVar1);
  }
  _kjCondition.right = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,7,8,piVar1);
  _kjCondition.left = 0x1a;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0x1a;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_68 = 0x1a;
    local_64 = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,7,8);
    kj::_::Debug::log<char_const(&)[43],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
               ,0x73,ERROR,
               "\"failed: expected \" \"(7 + 8 + 11) == (f(7, 8))\", _kjCondition, 7 + 8 + 11, f(7, 8)"
               ,(char (*) [43])"failed: expected (7 + 8 + 11) == (f(7, 8))",&_kjCondition,&local_68,
               &local_64);
  }
  _kjCondition.right = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,2,9);
  _kjCondition.left = 0x17;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0x17;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_68 = 0x17;
    local_64 = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,2,9);
    kj::_::Debug::log<char_const(&)[43],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
               ,0x74,ERROR,
               "\"failed: expected \" \"(9 + 2 + 12) == (f(2, 9))\", _kjCondition, 9 + 2 + 12, f(2, 9)"
               ,(char (*) [43])"failed: expected (9 + 2 + 12) == (f(2, 9))",&_kjCondition,&local_68,
               &local_64);
  }
  uVar2 = (ulong)local_2c;
  _kjCondition.op.content.ptr = (char *)operator_new(0x10);
  *(undefined ***)_kjCondition.op.content.ptr = &PTR_operator___005884d8;
  *(ulong *)(_kjCondition.op.content.ptr + 8) = uVar2;
  _kjCondition._0_8_ =
       &kj::_::
        HeapDisposer<kj::ConstFunction<int(int,int)>::Impl<kj::_::BoundMethod<kj::(anonymous_namespace)::TestConstType,kj::(anonymous_namespace)::TestCase100::run()::$_6,kj::(anonymous_namespace)::TestCase100::run()::$_7>>>
        ::instance;
  Own<kj::ConstFunction<int_(int,_int)>::Iface,_std::nullptr_t>::operator=
            (&f.impl,(Own<kj::ConstFunction<int_(int,_int)>::Iface,_std::nullptr_t> *)&_kjCondition)
  ;
  Own<kj::ConstFunction<int_(int,_int)>::Iface,_std::nullptr_t>::dispose
            ((Own<kj::ConstFunction<int_(int,_int)>::Iface,_std::nullptr_t> *)&_kjCondition);
  local_2c = 0x4d2;
  _kjCondition.right = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,0x7b,0x1c8);
  piVar1 = (int *)0x246;
  _kjCondition.left = 0x246;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0x246;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_68 = 0x246;
    local_64 = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,0x7b,0x1c8);
    piVar1 = &local_64;
    kj::_::Debug::log<char_const(&)[50],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
               ,0x7a,ERROR,
               "\"failed: expected \" \"(123 + 456 + 3) == (f(123, 456))\", _kjCondition, 123 + 456 + 3, f(123, 456)"
               ,(char (*) [50])"failed: expected (123 + 456 + 3) == (f(123, 456))",&_kjCondition,
               &local_68,piVar1);
  }
  _kjCondition.right = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,7,8,piVar1);
  _kjCondition.left = 0x13;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0x13;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_68 = 0x13;
    local_64 = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,7,8);
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
               ,0x7b,ERROR,
               "\"failed: expected \" \"(7 + 8 + 4) == (f(7, 8))\", _kjCondition, 7 + 8 + 4, f(7, 8)"
               ,(char (*) [42])"failed: expected (7 + 8 + 4) == (f(7, 8))",&_kjCondition,&local_68,
               &local_64);
  }
  _kjCondition.right = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,2,9);
  _kjCondition.left = 0x10;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0x10;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_68 = 0x10;
    local_64 = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,2,9);
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/function-test.c++"
               ,0x7c,ERROR,
               "\"failed: expected \" \"(9 + 2 + 5) == (f(2, 9))\", _kjCondition, 9 + 2 + 5, f(2, 9)"
               ,(char (*) [42])"failed: expected (9 + 2 + 5) == (f(2, 9))",&_kjCondition,&local_68,
               &local_64);
  }
  Own<kj::ConstFunction<unsigned_int_(unsigned_int,_unsigned_int)>::Iface,_std::nullptr_t>::dispose
            (&f2.impl);
  Own<kj::ConstFunction<int_(int,_int)>::Iface,_std::nullptr_t>::dispose(&f.impl);
  return;
}

Assistant:

TEST(ConstFunction, Method) {
  TestConstType obj;
  ConstFunction<int(int, int)> f = KJ_BIND_METHOD(obj, foo);
  ConstFunction<uint(uint, uint)> f2 = KJ_BIND_METHOD(obj, foo);

  EXPECT_EQ(123 + 456, f(123, 456));
  EXPECT_EQ(7 + 8 + 1, f(7, 8));
  EXPECT_EQ(9u + 2u + 2u, f2(2, 9));

  EXPECT_EQ(3, obj.callCount);

  // Bind to a temporary.
  f = KJ_BIND_METHOD(TestConstType(10), foo);

  EXPECT_EQ(123 + 456 + 10, f(123, 456));
  EXPECT_EQ(7 + 8 + 11, f(7, 8));
  EXPECT_EQ(9 + 2 + 12, f(2, 9));

  // Bind to a move.
  f = KJ_BIND_METHOD(kj::mv(obj), foo);
  obj.callCount = 1234;

  EXPECT_EQ(123 + 456 + 3, f(123, 456));
  EXPECT_EQ(7 + 8 + 4, f(7, 8));
  EXPECT_EQ(9 + 2 + 5, f(2, 9));
}